

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O3

void __thiscall kj::_::Debug::Fault::~Fault(Fault *this)

{
  Exception *pEVar1;
  Exception local_160;
  
  pEVar1 = this->exception;
  if (pEVar1 != (Exception *)0x0) {
    local_160.ownFile.content.ptr = (pEVar1->ownFile).content.ptr;
    local_160.ownFile.content.size_ = (pEVar1->ownFile).content.size_;
    local_160.ownFile.content.disposer = (pEVar1->ownFile).content.disposer;
    (pEVar1->ownFile).content.ptr = (char *)0x0;
    (pEVar1->ownFile).content.size_ = 0;
    local_160.file = pEVar1->file;
    local_160.line = pEVar1->line;
    local_160.type = pEVar1->type;
    local_160.description.content.ptr = (pEVar1->description).content.ptr;
    local_160.description.content.size_ = (pEVar1->description).content.size_;
    (pEVar1->description).content.ptr = (char *)0x0;
    (pEVar1->description).content.size_ = 0;
    local_160.description.content.disposer = (pEVar1->description).content.disposer;
    local_160.context.ptr.disposer = (pEVar1->context).ptr.disposer;
    local_160.context.ptr.ptr = (pEVar1->context).ptr.ptr;
    (pEVar1->context).ptr.ptr = (Context *)0x0;
    memcpy(local_160.trace,pEVar1->trace,0x104);
    pEVar1 = this->exception;
    if (pEVar1 != (Exception *)0x0) {
      Exception::~Exception(pEVar1);
    }
    operator_delete(pEVar1,0x158);
    throwRecoverableException(&local_160,2);
    Exception::~Exception(&local_160);
  }
  return;
}

Assistant:

Debug::Fault::~Fault() noexcept(false) {
  if (exception != nullptr) {
    Exception copy = mv(*exception);
    delete exception;
    throwRecoverableException(mv(copy), 2);
  }
}